

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall dynet::MomentumSGDTrainer::restart(MomentumSGDTrainer *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  ShadowParameters sp;
  Tensor local_78;
  vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> local_38;
  
  pSVar1 = (this->vp).
           super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar4 = (this->vp).
                super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    local_78.d.d._0_8_ = *(undefined8 *)(pSVar4->h).d.d;
    local_78.d.d._8_8_ = *(undefined8 *)((pSVar4->h).d.d + 2);
    local_78.d.d._16_8_ = *(undefined8 *)((pSVar4->h).d.d + 4);
    local_78.d._24_8_ = *(undefined8 *)((pSVar4->h).d.d + 6);
    local_78._32_8_ = *(undefined8 *)&(pSVar4->h).d.bd;
    local_78.v = (pSVar4->h).v;
    local_78.device = (pSVar4->h).device;
    local_78.mem_pool = (pSVar4->h).mem_pool;
    local_78._60_4_ = *(undefined4 *)&(pSVar4->h).field_0x3c;
    TensorTools::zero(&local_78);
  }
  pSVar3 = (this->vlp).
           super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->vlp).
           super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar3 != pSVar2) {
    do {
      local_78.d.d._0_8_ = *(undefined8 *)(pSVar3->all_h).d.d;
      local_78.d.d._8_8_ = *(undefined8 *)((pSVar3->all_h).d.d + 2);
      local_78.d.d._16_8_ = *(undefined8 *)((pSVar3->all_h).d.d + 4);
      local_78.d._24_8_ = *(undefined8 *)((pSVar3->all_h).d.d + 6);
      local_78._32_8_ = *(undefined8 *)&(pSVar3->all_h).d.bd;
      local_78.v = (pSVar3->all_h).v;
      local_78.device = (pSVar3->all_h).device;
      local_78.mem_pool = (pSVar3->all_h).mem_pool;
      local_78._60_4_ = *(undefined4 *)&(pSVar3->all_h).field_0x3c;
      std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::vector(&local_38,&pSVar3->h);
      TensorTools::zero(&local_78);
      if (local_38.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
  }
  return;
}

Assistant:

void MomentumSGDTrainer::restart() {
  for (auto sp : vp)
    TensorTools::zero(sp.h);
  for (auto slp : vlp)
    TensorTools::zero(slp.all_h);
}